

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.hpp
# Opt level: O0

void remora::bindings::
     conv2d<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::vector<float,remora::cpu_tag>,remora::matrix<float,remora::row_major,remora::cpu_tag>>
               (matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *images,vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag>
                        *filter,
               matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
               *outputs,size_t num_channels,size_t num_filters,size_t image_height,
               size_t image_width,size_t filter_height,size_t filter_width,size_t padding_height,
               size_t padding_width)

{
  size_t padding_height_00;
  size_t filter_width_00;
  matrix<float,_remora::row_major,_remora::cpu_tag> *this;
  matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *output;
  pointer num_channels_00;
  const_reference pvVar1;
  reference pfVar2;
  long in_RCX;
  matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDX;
  size_t filter_height_00;
  vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag> *in_RSI;
  matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  long in_R8;
  size_t in_R9;
  storage_type sVar3;
  long in_stack_00000008;
  long in_stack_00000010;
  pointer in_stack_00000018;
  matrix<float,_remora::row_major,_remora::cpu_tag> *in_stack_00000020;
  matrix_expression<remora::dense_matrix_adaptor<float,_remora::column_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_00000028;
  size_t i;
  size_t f;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
  output_transformed;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
  filter_transformed;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag> image_transformed
  ;
  value_type *filter_storage;
  value_type *image_storage;
  aligned_allocator<float,_64UL> allocator;
  size_t num_images;
  size_t filter_size;
  size_t output_rows_per_filter;
  matrix<float,_remora::row_major,_remora::cpu_tag> *in_stack_fffffffffffffee0;
  matrix_expression<remora::dense_matrix_adaptor<float,_remora::column_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffee8;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
  *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  value_type vVar4;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>
  *in_stack_ffffffffffffff00;
  aligned_allocator<float,_64UL> *in_stack_ffffffffffffff08;
  size_t local_e0;
  long local_d8;
  size_t in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff58;
  matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffffb0;
  
  padding_height_00 =
       ((in_R9 - in_stack_00000010) + 1 + (long)in_stack_00000020) *
       (long)(in_stack_00000028 + (in_stack_00000008 - (long)in_stack_00000018) + 1);
  filter_width_00 = (long)in_stack_00000018 * in_stack_00000010 * in_RCX;
  this = matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
         ::operator()(in_RDI);
  matrix<float,_remora::row_major,_remora::cpu_tag>::size1(this);
  output = (matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
            *)boost::alignment::aligned_allocator<float,_64UL>::allocate
                        (in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00,
                         (const_void_pointer)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  num_channels_00 =
       boost::alignment::aligned_allocator<float,_64UL>::allocate
                 (in_stack_ffffffffffffff08,(size_type)in_stack_ffffffffffffff00,
                  (const_void_pointer)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
  ;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>::
  dense_matrix_adaptor
            (in_stack_ffffffffffffff00,
             (float *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (size_type)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
             (size_type)in_stack_fffffffffffffee0);
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>::
  dense_matrix_adaptor
            (in_stack_ffffffffffffff00,
             (float *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (size_type)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
             (size_type)in_stack_fffffffffffffee0);
  matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>::
  operator()(in_RDX);
  sVar3 = matrix<float,_remora::row_major,_remora::cpu_tag>::raw_storage(in_stack_fffffffffffffee0);
  filter_height_00 = sVar3.leading_dimension;
  dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>::
  dense_matrix_adaptor
            (in_stack_ffffffffffffff00,
             (float *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (size_type)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
             (size_type)in_stack_fffffffffffffee0);
  if ((in_stack_00000020 == (matrix<float,_remora::row_major,_remora::cpu_tag> *)0x0) &&
     (in_stack_00000028 ==
      (matrix_expression<remora::dense_matrix_adaptor<float,_remora::column_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
       *)0x0)) {
    im2mat<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,filter_height_00,
               in_stack_ffffffffffffff70);
  }
  else {
    im2mat_pad<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>>
              (in_stack_ffffffffffffffb0,output,(size_t)num_channels_00,in_stack_ffffffffffffff98,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,filter_width_00,padding_height_00
               ,in_R9);
    in_stack_fffffffffffffee0 = in_stack_00000020;
    in_stack_fffffffffffffee8 = in_stack_00000028;
  }
  for (local_d8 = 0; local_d8 != in_R8; local_d8 = local_d8 + 1) {
    for (local_e0 = 0; local_e0 != filter_width_00; local_e0 = local_e0 + 1) {
      vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag>::operator()(in_RSI)
      ;
      pvVar1 = vector<float,_remora::cpu_tag>::operator()
                         ((vector<float,_remora::cpu_tag> *)in_stack_fffffffffffffee0,
                          (size_type)in_stack_00000018);
      vVar4 = *pvVar1;
      pfVar2 = dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>::
               operator()(in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
                          (size_type)in_stack_fffffffffffffee0);
      *pfVar2 = vVar4;
    }
  }
  trans<remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>,remora::cpu_tag>
            ((matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)in_stack_fffffffffffffee0);
  kernels::
  gemm<remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<float,remora::row_major,remora::cpu_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<float,remora::column_major,remora::cpu_tag,remora::cpu_tag>>
            ((matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (matrix_expression<remora::dense_matrix_adaptor<float,_remora::row_major,_remora::cpu_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)in_stack_fffffffffffffee0,(value_type)((ulong)in_stack_00000018 >> 0x20));
  boost::alignment::aligned_allocator<float,_64UL>::deallocate
            ((aligned_allocator<float,_64UL> *)in_stack_fffffffffffffee0,in_stack_00000018,0x10b5f6)
  ;
  boost::alignment::aligned_allocator<float,_64UL>::deallocate
            ((aligned_allocator<float,_64UL> *)in_stack_fffffffffffffee0,in_stack_00000018,0x10b61c)
  ;
  return;
}

Assistant:

void conv2d(
	matrix_expression<E1, cpu_tag> const& images,
	vector_expression<E2, cpu_tag> const& filter,
	matrix_expression<M, cpu_tag>& outputs,
	std::size_t num_channels,
	std::size_t num_filters,
	std::size_t image_height,
	std::size_t image_width,
	std::size_t filter_height,
	std::size_t filter_width,
	std::size_t padding_height,
	std::size_t padding_width
){
	static_assert(std::is_same<typename E1::orientation, row_major>::value, "Column major not implemented");
	static_assert(std::is_same<typename E1::storage_type::storage_tag, continuous_dense_tag>::value, "Subranges not implemented");
	static_assert(std::is_same<typename M::orientation, row_major>::value, "Column major not implemented");
	typedef typename std::common_type<
		typename E1::value_type, typename E2::value_type, typename M::value_type
	>::type value_type;
	
	std::size_t output_rows_per_filter = (image_height  - filter_height +1 + padding_height) * (image_width - filter_width +1 + padding_width);
	std::size_t filter_size = filter_width * filter_height * num_channels;
	std::size_t num_images = images().size1();
	
	REMORA_SIZE_CHECK(outputs().size1() == images().size1());
	REMORA_SIZE_CHECK(outputs().size2() == num_filters * output_rows_per_filter);
	REMORA_SIZE_CHECK(images().size2() == num_channels * image_width * image_height);
	REMORA_SIZE_CHECK(filter().size() == num_filters * filter_size);
	
	//allocate storage and create temporary matrices
	boost::alignment::aligned_allocator<value_type,64> allocator;
	value_type* image_storage = allocator.allocate( num_images * output_rows_per_filter * filter_size);
	value_type* filter_storage = allocator.allocate(num_filters * filter_size);
	dense_matrix_adaptor<value_type, row_major, cpu_tag> image_transformed(image_storage,num_images * output_rows_per_filter, filter_size);
	dense_matrix_adaptor<value_type, row_major, cpu_tag> filter_transformed(filter_storage, num_filters, filter_size);
	dense_matrix_adaptor<value_type, row_major, cpu_tag> output_transformed(outputs().raw_storage().values, num_images * output_rows_per_filter, num_filters);
	//copy image to temporary storage
	if(padding_height == 0 && padding_width == 0){
		im2mat(images,image_transformed, num_channels, image_height, image_width, filter_height, filter_width);
	}else{
		im2mat_pad(images,image_transformed, num_channels, image_height, image_width, filter_height, filter_width, padding_height, padding_width);
	}
	//copy filters to temporary storage
	for(std::size_t f = 0; f != num_filters; ++f){
		for(std::size_t i = 0; i != filter_size; ++i){
			filter_transformed(f,i) = filter()(f * filter_size + i);
		}
	}
	
	//do the computation
	kernels::gemm(image_transformed, trans(filter_transformed), output_transformed, value_type(1.0));
	
	//deallocate storage
	allocator.deallocate(image_storage,num_images * output_rows_per_filter * filter_size);
	allocator.deallocate(filter_storage, num_filters * filter_size);
}